

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::RunContext::runCurrentTest(RunContext *this,string *redirectedCout,string *redirectedCerr)

{
  _Rb_tree_node_base *p_Var1;
  SourceLineInfo *_lineInfo;
  TestCase *_name;
  IStreamingReporter *pIVar2;
  pointer pUVar3;
  double *pdVar4;
  _Alloc_hider _Var5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool _missingAssertions;
  uint uVar8;
  streambuf *psVar9;
  _Rb_tree_node_base *p_Var10;
  RunState RVar11;
  Counts *pCVar12;
  pointer __pos;
  undefined1 auVar13 [16];
  Guard guard;
  SectionInfo testCaseSection;
  StreamRedirect cerrRedir;
  SectionStats testCaseSectionStats;
  string local_488;
  size_t local_468;
  size_t sStack_460;
  SectionInfo local_450;
  StreamRedirect local_3e8;
  undefined1 local_258 [72];
  _Alloc_hider local_210;
  char local_200 [16];
  Flags local_1f0;
  
  _name = this->m_activeTestCase;
  _lineInfo = &(_name->super_TestCaseInfo).lineInfo;
  SectionInfo::SectionInfo
            (&local_450,(string *)_name,&(_name->super_TestCaseInfo).description,_lineInfo);
  pIVar2 = (this->m_reporter).m_p;
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[9])(pIVar2,&local_450);
  local_468 = (this->m_totals).assertions.passed;
  sStack_460 = (this->m_totals).assertions.failed;
  local_3e8.m_stream = (ostream *)&local_3e8.m_oss;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"TEST_CASE","");
  local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"");
  AssertionInfo::AssertionInfo
            ((AssertionInfo *)local_258,(string *)&local_3e8,_lineInfo,&local_488,Normal);
  std::__cxx11::string::operator=((string *)&this->m_lastAssertionInfo,(string *)local_258);
  std::__cxx11::string::_M_assign((string *)&(this->m_lastAssertionInfo).lineInfo);
  (this->m_lastAssertionInfo).lineInfo.line = local_258._64_8_;
  std::__cxx11::string::operator=
            ((string *)&(this->m_lastAssertionInfo).capturedExpression,(string *)&local_210);
  (this->m_lastAssertionInfo).resultDisposition = local_1f0;
  if (local_210._M_p != local_200) {
    operator_delete(local_210._M_p);
  }
  if ((undefined1 *)local_258._32_8_ != local_258 + 0x30) {
    operator_delete((void *)local_258._32_8_);
  }
  if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
    operator_delete((void *)local_258._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_dataplus._M_p != &local_488.field_2) {
    operator_delete(local_488._M_dataplus._M_p);
  }
  if (local_3e8.m_stream != (ostream *)&local_3e8.m_oss) {
    operator_delete(local_3e8.m_stream);
  }
  local_488._M_dataplus._M_p = (pointer)(this->m_testCaseTracker).nullableValue;
  ((TestCaseTracker *)local_488._M_dataplus._M_p)->m_currentSection =
       (TrackedSection *)local_488._M_dataplus._M_p;
  ((TestCaseTracker *)local_488._M_dataplus._M_p)->m_completedASectionThisRun = false;
  if ((((TestCaseTracker *)local_488._M_dataplus._M_p)->m_testCase).m_runState == NotStarted) {
    (((TestCaseTracker *)local_488._M_dataplus._M_p)->m_testCase).m_runState = Executing;
  }
  gettimeofday((timeval *)local_258,(__timezone_ptr_t)0x0);
  uVar7 = local_258._8_8_;
  uVar6 = local_258._0_8_;
  uVar8 = (*(((this->m_reporter).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[4])();
  if ((uVar8 & 1) == 0) {
    (*(((this->m_activeTestCase->test).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[4])
              ();
  }
  else {
    StreamRedirect::StreamRedirect((StreamRedirect *)local_258,(ostream *)&std::cout,redirectedCout)
    ;
    StreamRedirect::StreamRedirect(&local_3e8,(ostream *)&std::cerr,redirectedCerr);
    (*(((this->m_activeTestCase->test).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[4])
              ();
    StreamRedirect::~StreamRedirect(&local_3e8);
    StreamRedirect::~StreamRedirect((StreamRedirect *)local_258);
  }
  gettimeofday((timeval *)local_258,(__timezone_ptr_t)0x0);
  _Var5._M_p = local_488._M_dataplus._M_p;
  psVar9 = (streambuf *)(local_258._8_8_ + ((local_258._0_8_ - uVar6) * 1000000 - uVar7));
  auVar13._8_4_ = (int)((ulong)psVar9 >> 0x20);
  auVar13._0_8_ = psVar9;
  auVar13._12_4_ = 0x45300000;
  p_Var10 = *(_Rb_tree_node_base **)(local_488._M_dataplus._M_p + 0x40);
  p_Var1 = (_Rb_tree_node_base *)(local_488._M_dataplus._M_p + 0x30);
  RVar11 = Completed;
  do {
    if (p_Var10 == p_Var1) {
LAB_0013fb41:
      *(RunState *)(_Var5._M_p + 0x20) = RVar11;
      __pos = (this->m_unfinishedSections).
              super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
              ._M_impl.super__Vector_impl_data._M_start;
      pUVar3 = (this->m_unfinishedSections).
               super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (__pos != pUVar3) {
        pCVar12 = &__pos->prevAssertions;
        do {
          (*(this->super_IResultCapture)._vptr_IResultCapture[4])
                    (*(double *)(pCVar12 + 1),this,(long)(pCVar12 + -7) + 8,pCVar12);
          pdVar4 = (double *)(pCVar12 + 1);
          pCVar12 = pCVar12 + 8;
        } while ((pointer)(pdVar4 + 1) != pUVar3);
        __pos = (this->m_unfinishedSections).
                super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
                ._M_impl.super__Vector_impl_data._M_start;
      }
      std::
      vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
      ::_M_erase_at_end(&this->m_unfinishedSections,__pos);
      std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::_M_erase_at_end
                (&this->m_messages,
                 (this->m_messages).
                 super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl
                 .super__Vector_impl_data._M_start);
      local_3e8.m_stream = (ostream *)((this->m_totals).assertions.passed - local_468);
      local_3e8.m_prevBuf = (streambuf *)((this->m_totals).assertions.failed - sStack_460);
      _missingAssertions = testForMissingAssertions(this,(Counts *)&local_3e8);
      SectionStats::SectionStats
                ((SectionStats *)local_258,&local_450,(Counts *)&local_3e8,
                 ((auVar13._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)psVar9) - 4503599627370496.0)) / 1000000.0,
                 _missingAssertions);
      pIVar2 = (this->m_reporter).m_p;
      (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])(pIVar2,local_258);
      SectionStats::~SectionStats((SectionStats *)local_258);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450.lineInfo.file._M_dataplus._M_p != &local_450.lineInfo.file.field_2) {
        operator_delete(local_450.lineInfo.file._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450.description._M_dataplus._M_p != &local_450.description.field_2) {
        operator_delete(local_450.description._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450.name._M_dataplus._M_p != &local_450.name.field_2) {
        operator_delete(local_450.name._M_dataplus._M_p);
      }
      return;
    }
    if (p_Var10[3]._M_color != 3) {
      RVar11 = ExecutingChildren;
      goto LAB_0013fb41;
    }
    p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
  } while( true );
}

Assistant:

void runCurrentTest( std::string& redirectedCout, std::string& redirectedCerr ) {
            TestCaseInfo const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
            SectionInfo testCaseSection( testCaseInfo.name, testCaseInfo.description, testCaseInfo.lineInfo );
            m_reporter->sectionStarting( testCaseSection );
            Counts prevAssertions = m_totals.assertions;
            double duration = 0;
            try {
                m_lastAssertionInfo = AssertionInfo( "TEST_CASE", testCaseInfo.lineInfo, "", ResultDisposition::Normal );
                TestCaseTracker::Guard guard( *m_testCaseTracker );

                Timer timer;
                timer.start();
                if( m_reporter->getPreferences().shouldRedirectStdOut ) {
                    StreamRedirect coutRedir( std::cout, redirectedCout );
                    StreamRedirect cerrRedir( std::cerr, redirectedCerr );
                    m_activeTestCase->invoke();
                }
                else {
                    m_activeTestCase->invoke();
                }
                duration = timer.getElapsedSeconds();
            }
            catch( TestFailureException& ) {
                // This just means the test was aborted due to failure
            }
            catch(...) {
                ExpressionResultBuilder exResult( ResultWas::ThrewException );
                exResult << translateActiveException();
                actOnCurrentResult( exResult.buildResult( m_lastAssertionInfo )  );
            }
            // If sections ended prematurely due to an exception we stored their
            // infos here so we can tear them down outside the unwind process.
            for( std::vector<UnfinishedSections>::const_iterator it = m_unfinishedSections.begin(),
                        itEnd = m_unfinishedSections.end();
                    it != itEnd;
                    ++it )
                sectionEnded( it->info, it->prevAssertions, it->durationInSeconds );
            m_unfinishedSections.clear();
            m_messages.clear();

            Counts assertions = m_totals.assertions - prevAssertions;
            bool missingAssertions = testForMissingAssertions( assertions );

            SectionStats testCaseSectionStats( testCaseSection, assertions, duration, missingAssertions );
            m_reporter->sectionEnded( testCaseSectionStats );
        }